

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall LatencyItem::LatencyItem(LatencyItem *this,LatencyItem *src)

{
  string *in_RSI;
  Histogram *in_RDI;
  Histogram *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  Histogram::Histogram(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

LatencyItem(const LatencyItem& src)
        : statName(src.statName)
        , hist(src.hist) {}